

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_FSA_dns.c
# Opt level: O0

int main(void)

{
  double dVar1;
  int iVar2;
  undefined8 uVar3;
  SUNContext ctx;
  SUNLinearSolver LS;
  SUNMatrix A;
  sunrealtype atolS [2];
  int is;
  int retval;
  sunrealtype Gp [2];
  sunrealtype Gm [2];
  sunrealtype G;
  sunrealtype dp;
  sunrealtype pbar [2];
  sunrealtype tret;
  N_Vector *qS;
  N_Vector *ypS;
  N_Vector *yyS;
  N_Vector q;
  N_Vector id;
  N_Vector yp;
  N_Vector yy;
  void *mem;
  UserData data;
  int in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff30;
  void *pvVar4;
  undefined8 local_b8;
  undefined8 local_b0;
  int local_a0;
  int local_9c;
  double local_98;
  void *in_stack_ffffffffffffff70;
  double dVar5;
  UserData in_stack_ffffffffffffff80;
  UserData data_00;
  N_Vector in_stack_ffffffffffffff88;
  N_Vector yp_00;
  N_Vector in_stack_ffffffffffffff90;
  N_Vector yy_00;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  undefined8 *local_50;
  long local_48;
  long local_40;
  long *local_38;
  long *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  pvVar4 = (void *)0x0;
  local_9c = SUNContext_Create(0,&stack0xffffffffffffff30);
  iVar2 = check_retval(pvVar4,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  if (iVar2 == 0) {
    local_30 = (long *)N_VNew_Serial(10,in_stack_ffffffffffffff30);
    local_20 = N_VClone(local_30);
    local_28 = N_VClone(local_30);
    local_38 = (long *)N_VNew_Serial(1,in_stack_ffffffffffffff30);
    local_40 = N_VCloneVectorArray(2,local_20);
    local_48 = N_VCloneVectorArray(2,local_28);
    local_50 = (undefined8 *)N_VCloneVectorArray(2,local_38);
    local_10 = (undefined8 *)malloc(0x48);
    *local_10 = 0x3fe0000000000000;
    local_10[1] = 0x3ff0000000000000;
    local_10[4] = 0x3ff0000000000000;
    local_10[3] = 0x3ff0000000000000;
    local_10[2] = 0x4000000000000000;
    local_10[6] = 0x3ff0000000000000;
    local_10[7] = 0x3ff0000000000000;
    local_10[5] = 0x3ff0000000000000;
    local_10[8] = 0x3ff0000000000000;
    N_VConst(0x3ff0000000000000,local_30);
    *(undefined8 *)(*(long *)(*local_30 + 0x10) + 0x48) = 0;
    *(undefined8 *)(*(long *)(*local_30 + 0x10) + 0x40) = 0;
    *(undefined8 *)(*(long *)(*local_30 + 0x10) + 0x38) = 0;
    *(undefined8 *)(*(long *)(*local_30 + 0x10) + 0x30) = 0;
    printf("\nSlider-Crank example for IDAS:\n");
    setIC(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    for (local_a0 = 0; local_a0 < 2; local_a0 = local_a0 + 1) {
      N_VConst(0,*(undefined8 *)(local_40 + (long)local_a0 * 8));
      N_VConst(0,*(undefined8 *)(local_48 + (long)local_a0 * 8));
    }
    local_18 = IDACreate(in_stack_ffffffffffffff30);
    local_9c = IDAInit(0,local_18,ressc,local_20,local_28);
    local_9c = IDASStolerances(0x3eb0c6f7a0b5ed8d,0x3e7ad7f29abcaf48,local_18);
    local_9c = IDASetUserData(local_18,local_10);
    local_9c = IDASetId(local_18,local_30);
    local_9c = IDASetSuppressAlg(local_18,1);
    local_9c = IDASetMaxNumSteps(local_18,20000);
    uVar3 = SUNDenseMatrix(10,10,in_stack_ffffffffffffff30);
    iVar2 = check_retval(pvVar4,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    if (iVar2 == 0) {
      pvVar4 = (void *)SUNLinSol_Dense(local_20,uVar3,in_stack_ffffffffffffff30);
      iVar2 = check_retval(pvVar4,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
      if (iVar2 == 0) {
        local_9c = IDASetLinearSolver(local_18,pvVar4,uVar3);
        iVar2 = check_retval(pvVar4,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
        if (iVar2 == 0) {
          local_9c = IDASensInit(local_18,2,1,0,local_40,local_48);
          local_68 = local_10[6];
          local_60 = local_10[7];
          local_9c = IDASetSensParams(local_18,local_10 + 6,&local_68,0);
          local_9c = IDASensEEtolerances(local_18);
          IDASetSensErrCon(local_18,1);
          N_VConst(0,local_38);
          local_9c = IDAQuadInit(local_18,rhsQ,local_38);
          local_9c = IDAQuadSStolerances(0x3eb0c6f7a0b5ed8d,0x3e45798ee2308c3a,local_18);
          local_9c = IDASetQuadErrCon(local_18,1);
          for (local_a0 = 0; local_a0 < 2; local_a0 = local_a0 + 1) {
            N_VConst(0,local_50[local_a0]);
          }
          local_9c = IDAQuadSensInit(local_18,rhsQS,local_50);
          local_b0 = 0x3e45798ee2308c3a;
          local_b8 = 0x3e45798ee2308c3a;
          local_9c = IDAQuadSensSStolerances(0x3eb0c6f7a0b5ed8d,local_18,&local_b8);
          local_9c = IDASetQuadSensErrCon(local_18,1);
          printf("\nForward integration ... ");
          local_9c = IDASolve(0x4024000000000000,local_18,local_58,local_20,local_28,1);
          iVar2 = check_retval(pvVar4,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
          if (iVar2 == 0) {
            printf("done!\n");
            local_9c = PrintFinalStats(in_stack_ffffffffffffff70);
            iVar2 = check_retval(pvVar4,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
            if (iVar2 == 0) {
              IDAGetQuad(local_18,local_58,local_38);
              printf("--------------------------------------------\n");
              printf("  G = %24.16f\n",**(undefined8 **)(*local_38 + 0x10));
              printf("--------------------------------------------\n\n");
              IDAGetQuadSens(local_18,local_58,local_50);
              printf("-------------F O R W A R D------------------\n");
              printf("   dG/dp:  %12.4e %12.4e\n",**(undefined8 **)(*(long *)*local_50 + 0x10),
                     **(undefined8 **)(*(long *)local_50[1] + 0x10));
              printf("--------------------------------------------\n\n");
              IDAFree(&local_18);
              SUNLinSolFree(pvVar4);
              SUNMatDestroy(uVar3);
              yy_00 = (N_Vector)&DAT_3ee4f8b588e368f1;
              local_10[6] = 0x3ff0000000000000;
              local_10[7] = 0x3ff0000000000000;
              local_18 = IDACreate(in_stack_ffffffffffffff30);
              setIC(yy_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
              local_9c = IDAInit(0,local_18,ressc,local_20,local_28);
              local_9c = IDASStolerances(0x3eb0c6f7a0b5ed8d,0x3e45798ee2308c3a,local_18);
              local_9c = IDASetUserData(local_18,local_10);
              local_9c = IDASetId(local_18,local_30);
              local_9c = IDASetSuppressAlg(local_18,1);
              uVar3 = SUNDenseMatrix(10,10,in_stack_ffffffffffffff30);
              iVar2 = check_retval(pvVar4,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
              if (iVar2 == 0) {
                pvVar4 = (void *)SUNLinSol_Dense(local_20,uVar3,in_stack_ffffffffffffff30);
                iVar2 = check_retval(pvVar4,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
                if (iVar2 == 0) {
                  local_9c = IDASetLinearSolver(local_18,pvVar4,uVar3);
                  iVar2 = check_retval(pvVar4,in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
                  if (iVar2 == 0) {
                    N_VConst(0,local_38);
                    IDAQuadInit(local_18,rhsQ,local_38);
                    IDAQuadSStolerances(0x3eb0c6f7a0b5ed8d,0x3e45798ee2308c3a,local_18);
                    IDASetQuadErrCon(local_18,1);
                    IDASolve(0x4024000000000000,local_18,local_58,local_20,local_28,1);
                    IDAGetQuad(local_18,local_58,local_38);
                    yp_00 = (N_Vector)**(undefined8 **)(*local_38 + 0x10);
                    local_10[6] = (double)local_10[6] - (double)yy_00;
                    setIC(yy_00,yp_00,in_stack_ffffffffffffff80);
                    IDAReInit(0,local_18,local_20,local_28);
                    N_VConst(0,local_38);
                    IDAQuadReInit(local_18,local_38);
                    IDASolve(0x4024000000000000,local_18,local_58,local_20,local_28,1);
                    IDAGetQuad(local_18,local_58,local_38);
                    dVar1 = **(double **)(*local_38 + 0x10);
                    local_10[6] = (double)yy_00 + (double)yy_00 + (double)local_10[6];
                    setIC(yy_00,yp_00,in_stack_ffffffffffffff80);
                    IDAReInit(0,local_18,local_20,local_28);
                    N_VConst(0,local_38);
                    IDAQuadReInit(local_18,local_38);
                    IDASolve(0x4024000000000000,local_18,local_58,local_20,local_28,1);
                    IDAGetQuad(local_18,local_58,local_38);
                    local_98 = **(double **)(*local_38 + 0x10);
                    local_10[6] = 0x3ff0000000000000;
                    local_10[7] = (double)local_10[7] - (double)yy_00;
                    setIC(yy_00,yp_00,in_stack_ffffffffffffff80);
                    IDAReInit(0,local_18,local_20,local_28);
                    N_VConst(0,local_38);
                    IDAQuadReInit(local_18,local_38);
                    IDASolve(0x4024000000000000,local_18,local_58,local_20,local_28,1);
                    IDAGetQuad(local_18,local_58,local_38);
                    data_00 = (UserData)**(undefined8 **)(*local_38 + 0x10);
                    local_10[7] = (double)yy_00 + (double)yy_00 + (double)local_10[7];
                    setIC(yy_00,yp_00,data_00);
                    IDAReInit(0,local_18,local_20,local_28);
                    N_VConst(0,local_38);
                    IDAQuadReInit(local_18,local_38);
                    IDASolve(0x4024000000000000,local_18,local_58,local_20,local_28,1);
                    IDAGetQuad(local_18,local_58,local_38);
                    dVar5 = **(double **)(*local_38 + 0x10);
                    IDAFree(&local_18);
                    SUNLinSolFree(pvVar4);
                    SUNMatDestroy(uVar3);
                    printf("\n\n   Checking using Finite Differences \n\n");
                    printf("---------------BACKWARD------------------\n");
                    printf("   dG/dp:  %12.4e %12.4e\n",((double)yp_00 - dVar1) / (double)yy_00,
                           ((double)yp_00 - (double)data_00) / (double)yy_00);
                    printf("-----------------------------------------\n\n");
                    printf("---------------FORWARD-------------------\n");
                    printf("   dG/dp:  %12.4e %12.4e\n",(local_98 - (double)yp_00) / (double)yy_00,
                           (dVar5 - (double)yp_00) / (double)yy_00);
                    printf("-----------------------------------------\n\n");
                    printf("--------------CENTERED-------------------\n");
                    printf("   dG/dp:  %12.4e %12.4e\n",(local_98 - dVar1) / ((double)yy_00 * 2.0),
                           (dVar5 - (double)data_00) / ((double)yy_00 * 2.0));
                    printf("-----------------------------------------\n\n");
                    free(local_10);
                    N_VDestroy(local_30);
                    N_VDestroy(local_20);
                    N_VDestroy(local_28);
                    N_VDestroy(local_38);
                    N_VDestroyVectorArray(local_40,2);
                    N_VDestroyVectorArray(local_48,2);
                    N_VDestroyVectorArray(local_50,2);
                    SUNContext_Free(&stack0xffffffffffffff30);
                    local_4 = 0;
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  UserData data;

  void* mem;
  N_Vector yy, yp, id, q, *yyS, *ypS, *qS;
  sunrealtype tret;
  sunrealtype pbar[2];
  sunrealtype dp, G, Gm[2], Gp[2];
  int retval, is;
  sunrealtype atolS[NP];
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  A  = NULL;
  LS = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  id = N_VNew_Serial(NEQ, ctx);
  yy = N_VClone(id);
  yp = N_VClone(id);
  q  = N_VNew_Serial(1, ctx);

  yyS = N_VCloneVectorArray(NP, yy);
  ypS = N_VCloneVectorArray(NP, yp);
  qS  = N_VCloneVectorArray(NP, q);

  data = (UserData)malloc(sizeof *data);

  data->a         = 0.5; /* half-length of crank */
  data->J1        = 1.0; /* crank moment of inertia */
  data->m2        = 1.0; /* mass of connecting rod */
  data->m1        = 1.0;
  data->J2        = 2.0; /* moment of inertia of connecting rod */
  data->params[0] = 1.0; /* spring constant */
  data->params[1] = 1.0; /* damper constant */
  data->l0        = 1.0; /* spring free length */
  data->F         = 1.0; /* external constant force */

  N_VConst(ONE, id);
  NV_Ith_S(id, 9) = ZERO;
  NV_Ith_S(id, 8) = ZERO;
  NV_Ith_S(id, 7) = ZERO;
  NV_Ith_S(id, 6) = ZERO;

  printf("\nSlider-Crank example for IDAS:\n");

  /* Consistent IC*/
  setIC(yy, yp, data);

  for (is = 0; is < NP; is++)
  {
    N_VConst(ZERO, yyS[is]);
    N_VConst(ZERO, ypS[is]);
  }

  /* IDA initialization */
  mem    = IDACreate(ctx);
  retval = IDAInit(mem, ressc, TBEGIN, yy, yp);
  retval = IDASStolerances(mem, RTOLF, ATOLF);
  retval = IDASetUserData(mem, data);
  retval = IDASetId(mem, id);
  retval = IDASetSuppressAlg(mem, SUNTRUE);
  retval = IDASetMaxNumSteps(mem, 20000);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  retval  = IDASensInit(mem, NP, IDA_SIMULTANEOUS, NULL, yyS, ypS);
  pbar[0] = data->params[0];
  pbar[1] = data->params[1];
  retval  = IDASetSensParams(mem, data->params, pbar, NULL);
  retval  = IDASensEEtolerances(mem);
  IDASetSensErrCon(mem, SUNTRUE);

  N_VConst(ZERO, q);
  retval = IDAQuadInit(mem, rhsQ, q);
  retval = IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  retval = IDASetQuadErrCon(mem, SUNTRUE);

  for (is = 0; is < NP; is++) { N_VConst(ZERO, qS[is]); }
  retval   = IDAQuadSensInit(mem, rhsQS, qS);
  atolS[0] = atolS[1] = ATOLQ;
  retval              = IDAQuadSensSStolerances(mem, RTOLQ, atolS);
  retval              = IDASetQuadSensErrCon(mem, SUNTRUE);

  /* Perform forward run */
  printf("\nForward integration ... ");

  retval = IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  if (check_retval(&retval, "IDASolve", 1)) { return (1); }

  printf("done!\n");

  retval = PrintFinalStats(mem);
  if (check_retval(&retval, "PrintFinalStats", 1)) { return (1); }

  IDAGetQuad(mem, &tret, q);
  printf("--------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("  G = %24.16Lf\n", Ith(q, 1));
#else
  printf("  G = %24.16f\n", Ith(q, 1));
#endif
  printf("--------------------------------------------\n\n");

  IDAGetQuadSens(mem, &tret, qS);
  printf("-------------F O R W A R D------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", Ith(qS[0], 1), Ith(qS[1], 1));
#else
  printf("   dG/dp:  %12.4e %12.4e\n", Ith(qS[0], 1), Ith(qS[1], 1));
#endif
  printf("--------------------------------------------\n\n");

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  /* Finite differences for dG/dp */
  dp              = 0.00001;
  data->params[0] = ONE;
  data->params[1] = ONE;

  mem = IDACreate(ctx);

  setIC(yy, yp, data);
  retval = IDAInit(mem, ressc, TBEGIN, yy, yp);
  retval = IDASStolerances(mem, RTOLFD, ATOLFD);
  retval = IDASetUserData(mem, data);
  retval = IDASetId(mem, id);
  retval = IDASetSuppressAlg(mem, SUNTRUE);

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  N_VConst(ZERO, q);
  IDAQuadInit(mem, rhsQ, q);
  IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  IDASetQuadErrCon(mem, SUNTRUE);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);

  IDAGetQuad(mem, &tret, q);
  G = Ith(q, 1);
  /*printf("  G  =%12.6e\n", Ith(q,1));*/

  /******************************
  * BACKWARD for k
  ******************************/
  data->params[0] -= dp;
  setIC(yy, yp, data);

  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gm[0] = Ith(q, 1);
  /*printf("Gm[0]=%12.6e\n", Ith(q,1));*/

  /****************************
  * FORWARD for k *
  ****************************/
  data->params[0] += (TWO * dp);
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gp[0] = Ith(q, 1);
  /*printf("Gp[0]=%12.6e\n", Ith(q,1));*/

  /* Backward for c */
  data->params[0] = ONE;
  data->params[1] -= dp;
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gm[1] = Ith(q, 1);

  /* Forward for c */
  data->params[1] += (TWO * dp);
  setIC(yy, yp, data);
  IDAReInit(mem, TBEGIN, yy, yp);

  N_VConst(ZERO, q);
  IDAQuadReInit(mem, q);

  IDASolve(mem, TEND, &tret, yy, yp, IDA_NORMAL);
  IDAGetQuad(mem, &tret, q);
  Gp[1] = Ith(q, 1);

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  printf("\n\n   Checking using Finite Differences \n\n");

  printf("---------------BACKWARD------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (G - Gm[0]) / dp, (G - Gm[1]) / dp);
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (G - Gm[0]) / dp, (G - Gm[1]) / dp);
#endif
  printf("-----------------------------------------\n\n");

  printf("---------------FORWARD-------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (Gp[0] - G) / dp, (Gp[1] - G) / dp);
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (Gp[0] - G) / dp, (Gp[1] - G) / dp);
#endif
  printf("-----------------------------------------\n\n");

  printf("--------------CENTERED-------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("   dG/dp:  %12.4Le %12.4Le\n", (Gp[0] - Gm[0]) / (TWO * dp),
         (Gp[1] - Gm[1]) / (TWO * dp));
#else
  printf("   dG/dp:  %12.4e %12.4e\n", (Gp[0] - Gm[0]) / (TWO * dp),
         (Gp[1] - Gm[1]) / (TWO * dp));
#endif
  printf("-----------------------------------------\n\n");

  /* Free memory */
  free(data);

  N_VDestroy(id);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(q);

  N_VDestroyVectorArray(yyS, NP);
  N_VDestroyVectorArray(ypS, NP);
  N_VDestroyVectorArray(qS, NP);

  SUNContext_Free(&ctx);

  return (0);
}